

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O0

FTextureID __thiscall FTextureManager::PalCheck(FTextureManager *this,FTextureID tex)

{
  bool bVar1;
  int key;
  int *piVar2;
  int *newtex;
  FTextureManager *this_local;
  FTextureID tex_local;
  
  this_local._0_4_ = tex.texnum;
  bVar1 = FBoolCVar::operator_cast_to_bool(&vid_nopalsubstitutions);
  if (bVar1) {
    this_local._4_4_ = this_local._0_4_;
  }
  else {
    key = FTextureID::GetIndex((FTextureID *)&this_local);
    piVar2 = TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::CheckKey
                       (&this->PalettedVersions,key);
    if ((piVar2 == (int *)0x0) || (*piVar2 == 0)) {
      this_local._4_4_ = this_local._0_4_;
    }
    else {
      FTextureID::FTextureID((FTextureID *)((long)&this_local + 4),*piVar2);
    }
  }
  return (FTextureID)this_local._4_4_;
}

Assistant:

FTextureID FTextureManager::PalCheck(FTextureID tex)
{
	if (vid_nopalsubstitutions) return tex;
	int *newtex = PalettedVersions.CheckKey(tex.GetIndex());
	if (newtex == NULL || *newtex == 0) return tex;
	return *newtex;
}